

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O1

void __thiscall
SignalProcessing::FIRFilter::FIRFilter
          (FIRFilter *this,size_t number_of_taps,float input_sample_rate,float low_frequency,
          float high_frequency,float attenuation)

{
  uint i;
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  vector<float,_std::allocator<float>_> A;
  allocator_type local_51;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  vector<float,_std::allocator<float>_> local_40;
  
  (this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 3;
  if (3 < number_of_taps) {
    uVar2 = number_of_taps;
  }
  local_50 = low_frequency;
  std::vector<short,_std::allocator<short>_>::resize(&this->filter_coefficients_,uVar2 | 1);
  std::vector<float,_std::allocator<float>_>::vector(&local_40,(uVar2 >> 1) + 1,&local_51);
  local_4c = 21.0;
  if (21.0 <= attenuation) {
    local_4c = attenuation;
  }
  local_44 = 2.0 / input_sample_rate;
  local_48 = input_sample_rate * 0.5;
  if (high_frequency <= input_sample_rate * 0.5) {
    local_48 = high_frequency;
  }
  *local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
   _M_start = ((local_48 - local_50) + (local_48 - local_50)) / input_sample_rate;
  uVar1 = 1;
  do {
    fVar4 = local_44 * (float)uVar1 * 3.1415927;
    fVar3 = sinf(local_48 * fVar4);
    fVar4 = sinf(fVar4 * local_50);
    local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar1] = (fVar3 - fVar4) / ((float)uVar1 * 3.1415927);
    uVar1 = (ulong)((int)uVar1 + 1);
  } while (uVar1 <= uVar2 >> 1);
  coefficients_for_idealised_filter_response
            ((this->filter_coefficients_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,local_4c,uVar2 | 1);
  if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

FIRFilter::FIRFilter(std::size_t number_of_taps, float input_sample_rate, float low_frequency, float high_frequency, float attenuation) {
	// we must be asked to filter based on an odd number of
	// taps, and at least three
	if(number_of_taps < 3) number_of_taps = 3;
	if(attenuation < 21.0f) attenuation = 21.0f;

	// ensure we have an odd number of taps
	number_of_taps |= 1;

	// store instance variables
	filter_coefficients_.resize(number_of_taps);

	/* calculate idealised filter response */
	std::size_t Np = (number_of_taps - 1) / 2;
	float two_over_sample_rate = 2.0f / input_sample_rate;

	// Clamp the high cutoff frequency.
	high_frequency = std::min(high_frequency, input_sample_rate * 0.5f);

	std::vector<float> A(Np+1);
	A[0] = 2.0f * (high_frequency - low_frequency) / input_sample_rate;
	for(unsigned int i = 1; i <= Np; ++i) {
		float i_pi = float(i) * float(M_PI);
		A[i] =
			(
				sinf(two_over_sample_rate * i_pi * high_frequency) -
				sinf(two_over_sample_rate * i_pi * low_frequency)
			) / i_pi;
	}

	FIRFilter::coefficients_for_idealised_filter_response(filter_coefficients_.data(), A.data(), attenuation, number_of_taps);
}